

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O0

void printEdge(Edge *i_edge,int length)

{
  int local_18;
  int i;
  int length_local;
  Edge *i_edge_local;
  
  fprintf(_stdout,"Solution with %d edges ",(ulong)(uint)length);
  for (local_18 = 0; local_18 < length; local_18 = local_18 + 1) {
    fprintf(_stdout,"%d-%d ",(ulong)(uint)i_edge[local_18].start,(ulong)(uint)i_edge[local_18].end);
  }
  fprintf(_stdout,"\n");
  return;
}

Assistant:

void printEdge(const Edge *i_edge, int length)
{
    fprintf(stdout, "Solution with %d edges ", length);
    for (int i = 0; i < length; i++)
    {
        fprintf(stdout, "%d-%d ", i_edge[i].start, i_edge[i].end);
    }
    fprintf(stdout, "\n");
}